

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

uint rtsp_conncheck(Curl_easy *data,connectdata *conn,uint checks_to_perform)

{
  _Bool _Var1;
  _Bool local_21;
  uint local_20;
  uint uStack_1c;
  _Bool input_pending;
  uint ret_val;
  uint checks_to_perform_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_20 = 0;
  if (((checks_to_perform & 1) != 0) &&
     (uStack_1c = checks_to_perform, _ret_val = conn, conn_local = (connectdata *)data,
     _Var1 = Curl_conn_is_alive(data,conn,&local_21), !_Var1)) {
    local_20 = local_20 | 1;
  }
  return local_20;
}

Assistant:

static unsigned int rtsp_conncheck(struct Curl_easy *data,
                                   struct connectdata *conn,
                                   unsigned int checks_to_perform)
{
  unsigned int ret_val = CONNRESULT_NONE;
  (void)data;

  if(checks_to_perform & CONNCHECK_ISDEAD) {
    bool input_pending;
    if(!Curl_conn_is_alive(data, conn, &input_pending))
      ret_val |= CONNRESULT_DEAD;
  }

  return ret_val;
}